

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void absl::lts_20250127::PostSynchEvent(void *obj,int ev)

{
  int iVar1;
  int iVar2;
  SynchEvent *arg;
  char *local_5a0;
  bool read_lock;
  bool trylock;
  bool locking;
  Mutex *mu;
  Condition cond;
  int flags;
  char *absl_raw_log_internal_basename;
  int local_540;
  int b;
  int i;
  int pos;
  char buffer [960];
  int n;
  void *pcs [40];
  SynchEvent *e;
  int ev_local;
  void *obj_local;
  
  arg = GetSynchEvent(obj);
  if ((arg == (SynchEvent *)0x0) || ((arg->log & 1U) != 0)) {
    iVar1 = GetStackTrace((void **)&stack0xfffffffffffffe98,0x28,1);
    b = snprintf((char *)&i,0x3c0," @");
    local_540 = 0;
    for (; ((local_540 != iVar1 &&
            (iVar2 = snprintf((char *)((long)&i + (long)b),0x3c0 - (long)b," %p",
                              *(undefined8 *)(&stack0xfffffffffffffe98 + (long)local_540 * 8)),
            -1 < iVar2)) && ((ulong)(long)iVar2 < 0x3c0U - (long)b)); b = iVar2 + b) {
      local_540 = local_540 + 1;
    }
    if (arg == (SynchEvent *)0x0) {
      local_5a0 = "";
    }
    else {
      local_5a0 = arg->name;
    }
    raw_log_internal::RawLog
              (kInfo,"mutex.cc",0x1c4,"%s%p %s %s",
               *(undefined8 *)(event_properties + (long)ev * 0x10 + 8),obj,local_5a0,&i);
  }
  cond.arg_._4_4_ = *(uint *)(event_properties + (long)ev * 0x10);
  if ((((cond.arg_._4_4_ & 2) != 0) && (arg != (SynchEvent *)0x0)) &&
     (arg->invariant != (_func_void_void_ptr *)0x0)) {
    Condition::Condition<absl::lts_20250127::SynchEvent>
              ((Condition *)&mu,
               PostSynchEvent(void*,int)::local::pred(absl::lts_20250127::SynchEvent__,arg);
    EvalConditionAnnotated
              ((Condition *)&mu,(Mutex *)obj,(cond.arg_._4_4_ & 8) == 0,(cond.arg_._4_4_ & 4) != 0,
               (cond.arg_._4_4_ & 1) != 0);
  }
  UnrefSynchEvent(arg);
  return;
}

Assistant:

static void PostSynchEvent(void* obj, int ev) {
  SynchEvent* e = GetSynchEvent(obj);
  // logging is on if event recording is on and either there's no event struct,
  // or it explicitly says to log
  if (e == nullptr || e->log) {
    void* pcs[40];
    int n = absl::GetStackTrace(pcs, ABSL_ARRAYSIZE(pcs), 1);
    // A buffer with enough space for the ASCII for all the PCs, even on a
    // 64-bit machine.
    char buffer[ABSL_ARRAYSIZE(pcs) * 24];
    int pos = snprintf(buffer, sizeof(buffer), " @");
    for (int i = 0; i != n; i++) {
      int b = snprintf(&buffer[pos], sizeof(buffer) - static_cast<size_t>(pos),
                       " %p", pcs[i]);
      if (b < 0 ||
          static_cast<size_t>(b) >= sizeof(buffer) - static_cast<size_t>(pos)) {
        break;
      }
      pos += b;
    }
    ABSL_RAW_LOG(INFO, "%s%p %s %s", event_properties[ev].msg, obj,
                 (e == nullptr ? "" : e->name), buffer);
  }
  const int flags = event_properties[ev].flags;
  if ((flags & SYNCH_F_LCK) != 0 && e != nullptr && e->invariant != nullptr) {
    // Calling the invariant as is causes problems under ThreadSanitizer.
    // We are currently inside of Mutex Lock/Unlock and are ignoring all
    // memory accesses and synchronization. If the invariant transitively
    // synchronizes something else and we ignore the synchronization, we will
    // get false positive race reports later.
    // Reuse EvalConditionAnnotated to properly call into user code.
    struct local {
      static bool pred(SynchEvent* ev) {
        (*ev->invariant)(ev->arg);
        return false;
      }
    };
    Condition cond(&local::pred, e);
    Mutex* mu = static_cast<Mutex*>(obj);
    const bool locking = (flags & SYNCH_F_UNLOCK) == 0;
    const bool trylock = (flags & SYNCH_F_TRY) != 0;
    const bool read_lock = (flags & SYNCH_F_R) != 0;
    EvalConditionAnnotated(&cond, mu, locking, trylock, read_lock);
  }
  UnrefSynchEvent(e);
}